

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_interpreter_evaluateASTWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t astNode,sysbvm_tuple_t environment)

{
  sysbvm_tuple_t sVar1;
  ulong immediateTypeTag;
  anon_struct_8_1_3a3b9956 gcFrame;
  sysbvm_tuple_t local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  sysbvm_tuple_t *local_30;
  sysbvm_tuple_t local_28;
  sysbvm_tuple_t local_20;
  
  local_30 = &local_50;
  local_50 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 1;
  sysbvm_stackFrame_pushRecord(&local_48);
  immediateTypeTag = astNode & 0xf;
  if (immediateTypeTag == 0 && astNode != 0) {
    sVar1 = *(sysbvm_tuple_t *)astNode;
  }
  else if ((int)immediateTypeTag == 0xf) {
    sVar1 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,astNode >> 4);
  }
  else {
    sVar1 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
  }
  local_50 = sysbvm_type_getAstNodeEvaluationFunction(context,sVar1);
  if (local_50 != 0) {
    sysbvm_stackFrame_popRecord(&local_48);
    local_28 = astNode;
    local_20 = environment;
    sVar1 = sysbvm_function_apply(context,local_50,2,&local_28,1);
    return sVar1;
  }
  sysbvm_error("Cannot evaluate non AST node tuple.");
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_evaluateASTWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t astNode, sysbvm_tuple_t environment)
{
    struct {
        sysbvm_tuple_t function;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.function = sysbvm_type_getAstNodeEvaluationFunction(context, sysbvm_tuple_getType(context, astNode));
    if(!gcFrame.function)
        sysbvm_error("Cannot evaluate non AST node tuple.");

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_function_applyNoCheck2(context, gcFrame.function, astNode, environment);
}